

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void ImBitArraySetBitRange(ImU32 *arr,int n,int n2)

{
  byte local_28;
  ImU32 mask;
  int b_mod;
  int a_mod;
  int n2_local;
  int n_local;
  ImU32 *arr_local;
  
  for (a_mod = n; a_mod <= n2; a_mod = a_mod + 0x20U & 0xffffffe0) {
    if ((int)(a_mod | 0x1fU) < n2) {
      local_28 = 0x1f;
    }
    else {
      local_28 = (byte)n2 & 0x1f;
    }
    arr[a_mod >> 5] =
         (int)(1L << local_28 + 1) - 1U & ((int)(1L << ((byte)a_mod & 0x1f)) - 1U ^ 0xffffffff) |
         arr[a_mod >> 5];
  }
  return;
}

Assistant:

inline void     ImBitArraySetBitRange(ImU32* arr, int n, int n2)
{
    while (n <= n2)
    {
        int a_mod = (n & 31);
        int b_mod = (n2 > (n | 31) ? 31 : (n2 & 31)) + 1;
        ImU32 mask = (ImU32)(((ImU64)1 << b_mod) - 1) & ~(ImU32)(((ImU64)1 << a_mod) - 1);
        arr[n >> 5] |= mask;
        n = (n + 32) & ~31;
    }
}